

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonWidget.cpp
# Opt level: O1

void __thiscall ButtonWidget::render(ButtonWidget *this,bool selected)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ResourceManager *this_00;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 in_XMM1_Da;
  
  this_00 = ResourceManager::getInstance();
  if (this->center == true) {
    pvVar4 = ResourceManager::getData(this_00,4 - (uint)selected);
    uVar5 = al_map_rgb(0xff,0xff,0xff);
    iVar1 = this->x;
    iVar2 = this->y;
    iVar3 = al_get_font_line_height(pvVar4);
    al_draw_textf(uVar5,in_XMM1_Da,(float)iVar1,(float)(iVar2 - iVar3 / 2),pvVar4,1,"%s",this->text)
    ;
    return;
  }
  return;
}

Assistant:

void ButtonWidget::render(bool selected)
{
   ALLEGRO_FONT *myfont;
   ResourceManager& rm = ResourceManager::getInstance();

   if (center) {
      if (selected) {
         myfont = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
      }
      else {
         myfont = (ALLEGRO_FONT *)rm.getData(RES_SMALLFONT);
      }
      al_draw_textf(myfont, al_map_rgb(255, 255, 255), x, y-al_get_font_line_height(myfont)/2, ALLEGRO_ALIGN_CENTRE, "%s", text);
   }
}